

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLast
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  Node *pNVar1;
  int iVar2;
  long in_RDI;
  Node *next;
  int level;
  Node *x;
  int in_stack_ffffffffffffffdc;
  Node *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined8 local_10;
  
  pNVar1 = *(Node **)(in_RDI + 0x18);
  iVar2 = GetMaxHeight((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar2 = iVar2 + -1;
  while( true ) {
    do {
      local_10 = pNVar1;
      in_stack_ffffffffffffffe0 = Node::Next(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      pNVar1 = in_stack_ffffffffffffffe0;
    } while (in_stack_ffffffffffffffe0 != (Node *)0x0);
    if (iVar2 == 0) break;
    iVar2 = iVar2 + -1;
    pNVar1 = local_10;
  }
  return local_10;
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::FindLast()
    const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (next == nullptr) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}